

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.h
# Opt level: O0

cmCommand * __thiscall cmCMakePolicyCommand::Clone(cmCMakePolicyCommand *this)

{
  cmCommand *this_00;
  cmCMakePolicyCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmCMakePolicyCommand((cmCMakePolicyCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmCMakePolicyCommand; }